

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

bool httplib::detail::parse_multipart_boundary(string *content_type,string *boundary)

{
  size_type sVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  string local_68 [32];
  string local_48 [32];
  long local_28;
  size_type pos;
  string *boundary_local;
  string *content_type_local;
  
  pos = (size_type)boundary;
  boundary_local = content_type;
  local_28 = std::__cxx11::string::find((char *)content_type,0x18612c);
  if (local_28 == -1) {
    content_type_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)boundary_local);
    std::__cxx11::string::operator=((string *)pos,local_48);
    std::__cxx11::string::~string(local_48);
    uVar3 = std::__cxx11::string::length();
    if (1 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::front();
      if (*pcVar4 == '\"') {
        pcVar4 = (char *)std::__cxx11::string::back();
        sVar1 = pos;
        if (*pcVar4 == '\"') {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_68,sVar1);
          std::__cxx11::string::operator=((string *)pos,local_68);
          std::__cxx11::string::~string(local_68);
        }
      }
    }
    bVar2 = std::__cxx11::string::empty();
    content_type_local._7_1_ = (bool)((bVar2 ^ 0xff) & 1);
  }
  return content_type_local._7_1_;
}

Assistant:

inline bool parse_multipart_boundary(const std::string& content_type,
            std::string& boundary) {
            auto pos = content_type.find("boundary=");
            if (pos == std::string::npos) { return false; }
            boundary = content_type.substr(pos + 9);
            if (boundary.length() >= 2 && boundary.front() == '"' &&
                boundary.back() == '"') {
                boundary = boundary.substr(1, boundary.size() - 2);
            }
            return !boundary.empty();
        }